

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O1

void secp256k1_heap_down(uchar *arr,size_t i,size_t heap_size,size_t stride,
                        _func_int_void_ptr_void_ptr_void_ptr *cmp,void *cmp_data)

{
  byte *pbVar1;
  long lVar2;
  secp256k1_scalar *psVar3;
  byte bVar4;
  uchar uVar5;
  byte *pbVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  byte *extraout_RDX;
  uchar *sigend;
  secp256k1_scalar *unaff_RBX;
  secp256k1_scalar *psVar17;
  long lVar18;
  uint64_t uVar19;
  uchar *b_1;
  long lVar20;
  secp256k1_scalar *unaff_R14;
  uchar *a;
  secp256k1_scalar *psVar21;
  uchar *puVar22;
  long lVar23;
  size_t sVar24;
  uchar *b;
  int iStack_114;
  ulong uStack_110;
  uchar auStack_108 [40];
  secp256k1_scalar *psStack_e0;
  secp256k1_scalar *psStack_d8;
  secp256k1_scalar *psStack_d0;
  secp256k1_scalar *psStack_c8;
  code *pcStack_c0;
  uchar *local_b0;
  secp256k1_scalar *local_a8;
  _func_int_void_ptr_void_ptr_void_ptr *local_a0;
  void *local_98;
  uchar *local_90;
  uchar *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  secp256k1_scalar *local_40;
  secp256k1_scalar *local_38;
  
  local_38 = (secp256k1_scalar *)(heap_size >> 1);
  if (i < local_38) {
    local_90 = arr + -0x40;
    psVar17 = (secp256k1_scalar *)i;
    local_b0 = arr;
    local_a0 = cmp;
    local_98 = cmp_data;
    local_40 = (secp256k1_scalar *)heap_size;
    do {
      psVar3 = (secp256k1_scalar *)((long)psVar17 * 2 + 1);
      if (local_40 <= psVar3) {
        pcStack_c0 = secp256k1_der_read_len;
        secp256k1_heap_down_cold_1();
        if ((secp256k1_scalar *)arr == (secp256k1_scalar *)0x0) {
          psStack_c8 = (secp256k1_scalar *)secp256k1_der_parse_integer;
          secp256k1_der_read_len_cold_1();
          iStack_114 = 0;
          auStack_108[0x10] = '\0';
          auStack_108[0x11] = '\0';
          auStack_108[0x12] = '\0';
          auStack_108[0x13] = '\0';
          auStack_108[0x14] = '\0';
          auStack_108[0x15] = '\0';
          auStack_108[0x16] = '\0';
          auStack_108[0x17] = '\0';
          auStack_108[0x18] = '\0';
          auStack_108[0x19] = '\0';
          auStack_108[0x1a] = '\0';
          auStack_108[0x1b] = '\0';
          auStack_108[0x1c] = '\0';
          auStack_108[0x1d] = '\0';
          auStack_108[0x1e] = '\0';
          auStack_108[0x1f] = '\0';
          auStack_108[0] = '\0';
          auStack_108[1] = '\0';
          auStack_108[2] = '\0';
          auStack_108[3] = '\0';
          auStack_108[4] = '\0';
          auStack_108[5] = '\0';
          auStack_108[6] = '\0';
          auStack_108[7] = '\0';
          auStack_108[8] = '\0';
          auStack_108[9] = '\0';
          auStack_108[10] = '\0';
          auStack_108[0xb] = '\0';
          auStack_108[0xc] = '\0';
          auStack_108[0xd] = '\0';
          auStack_108[0xe] = '\0';
          auStack_108[0xf] = '\0';
          puVar22 = *(uchar **)i;
          if ((puVar22 != sigend) && (*puVar22 == '\x02')) {
            *(uchar **)i = puVar22 + 1;
            psStack_e0 = unaff_RBX;
            psStack_d8 = unaff_R14;
            psStack_d0 = psVar3;
            psStack_c8 = psVar17;
            iVar14 = secp256k1_der_read_len(&uStack_110,(uchar **)i,sigend);
            if ((((iVar14 != 0) &&
                 ((uStack_110 != 0 &&
                  (puVar22 = *(uchar **)i, uStack_110 <= (ulong)((long)sigend - (long)puVar22)))))
                && ((uVar5 = *puVar22, uStack_110 == 1 || uVar5 != '\0' || ((char)puVar22[1] < '\0')
                    ))) && ((uStack_110 == 1 || uVar5 != 0xff || (-1 < (char)puVar22[1])))) {
              if ((char)uVar5 < '\0') {
                iStack_114 = 1;
              }
              if (*puVar22 == '\0') {
                uStack_110 = uStack_110 - 1;
                *(uchar **)i = puVar22 + 1;
              }
              if (0x20 < uStack_110) {
                iStack_114 = 1;
              }
              if (iStack_114 == 0) {
                if (uStack_110 != 0) {
                  memcpy(auStack_108 + (0x20 - uStack_110),*(uchar **)i,uStack_110);
                }
                secp256k1_scalar_set_b32((secp256k1_scalar *)arr,auStack_108,&iStack_114);
              }
              if (iStack_114 != 0) {
                ((secp256k1_scalar *)arr)->d[2] = 0;
                ((secp256k1_scalar *)arr)->d[3] = 0;
                ((secp256k1_scalar *)arr)->d[0] = 0;
                ((secp256k1_scalar *)arr)->d[1] = 0;
                secp256k1_scalar_verify((secp256k1_scalar *)arr);
              }
              *(uchar **)i = *(uchar **)i + uStack_110;
            }
          }
          return;
        }
        ((secp256k1_scalar *)arr)->d[0] = 0;
        pbVar6 = *(byte **)i;
        if (pbVar6 < extraout_RDX) {
          pbVar1 = pbVar6 + 1;
          *(byte **)i = pbVar1;
          bVar4 = *pbVar6;
          if ((ulong)bVar4 != 0xff) {
            if ((char)bVar4 < '\0') {
              if (bVar4 != 0x80) {
                uVar15 = bVar4 & 0x7f;
                uVar16 = (ulong)uVar15;
                if ((((uVar16 <= (ulong)((long)extraout_RDX - (long)pbVar1)) && ((byte)uVar15 < 9))
                    && (*pbVar1 != 0)) && (uVar16 != 0)) {
                  uVar19 = ((secp256k1_scalar *)arr)->d[0];
                  pbVar6 = *(byte **)i;
                  do {
                    uVar19 = uVar19 << 8 | (ulong)*pbVar6;
                    ((secp256k1_scalar *)arr)->d[0] = uVar19;
                    *(byte **)i = pbVar6 + 1;
                    uVar16 = uVar16 - 1;
                    pbVar6 = pbVar6 + 1;
                  } while (uVar16 != 0);
                }
              }
            }
            else {
              ((secp256k1_scalar *)arr)->d[0] = (ulong)bVar4;
            }
          }
        }
        return;
      }
      unaff_RBX = (secp256k1_scalar *)((long)psVar17 * 2 + 2);
      if (unaff_RBX < local_40) {
        psVar21 = (secp256k1_scalar *)(local_b0 + (long)unaff_RBX * stride);
        pcStack_c0 = (code *)0x14a43b;
        iVar14 = (*local_a0)(psVar21,local_b0 + (long)psVar3 * stride,local_98);
        if (iVar14 < 0) goto LAB_0014a56f;
        puVar22 = local_b0 + (long)psVar17 * stride;
        pcStack_c0 = (code *)0x14a463;
        local_a8 = psVar21;
        iVar14 = (*local_a0)(psVar21,puVar22,local_98);
        if (iVar14 < 1) {
          return;
        }
        sVar24 = stride;
        if (0x40 < stride) {
          lVar20 = ((long)psVar17 * 2 + 3) * stride;
          lVar18 = (long)((long)psVar17->d + 1) * stride;
          lVar23 = 0;
          do {
            local_88 = *(uchar **)(local_90 + lVar23 + lVar18);
            uStack_80 = *(undefined8 *)(local_90 + lVar23 + lVar18 + 8);
            local_78 = *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x10);
            uStack_70 = *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x10 + 8);
            local_68 = *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x20);
            uStack_60 = *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x20 + 8);
            local_58 = *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x30);
            uStack_50 = *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x30 + 8);
            uVar7 = *(undefined8 *)(local_90 + lVar23 + lVar20 + 8);
            uVar8 = *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x10);
            uVar9 = *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x10 + 8);
            uVar10 = *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x20);
            uVar11 = *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x20 + 8);
            uVar12 = *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x30);
            uVar13 = *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x30 + 8);
            *(undefined8 *)(local_90 + lVar23 + lVar18) =
                 *(undefined8 *)(local_90 + lVar23 + lVar20);
            *(undefined8 *)(local_90 + lVar23 + lVar18 + 8) = uVar7;
            *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x30) = uVar12;
            *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x30 + 8) = uVar13;
            *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x20) = uVar10;
            *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x20 + 8) = uVar11;
            *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x10) = uVar8;
            *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x10 + 8) = uVar9;
            *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x30) = local_58;
            *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x30 + 8) = uStack_50;
            *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x20) = local_68;
            *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x20 + 8) = uStack_60;
            *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x10) = local_78;
            *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x10 + 8) = uStack_70;
            *(uchar **)(local_90 + lVar23 + lVar20) = local_88;
            *(undefined8 *)(local_90 + lVar23 + lVar20 + 8) = uStack_80;
            lVar2 = stride + lVar23;
            lVar23 = lVar23 + -0x40;
          } while (0x40 < lVar2 - 0x40U);
          sVar24 = lVar23 + stride;
        }
        i = (size_t)&local_88;
        pcStack_c0 = (code *)0x14a549;
        memcpy((void *)i,puVar22,sVar24);
        unaff_R14 = local_a8;
        pcStack_c0 = (code *)0x14a55c;
        memmove(puVar22,local_a8,sVar24);
        pcStack_c0 = (code *)0x14a56a;
        arr = (uchar *)unaff_R14;
        memcpy(unaff_R14,(void *)i,sVar24);
      }
      else {
LAB_0014a56f:
        arr = local_b0 + (long)psVar3 * stride;
        unaff_R14 = (secp256k1_scalar *)(local_b0 + (long)psVar17 * stride);
        pcStack_c0 = (code *)0x14a597;
        iVar14 = (*local_a0)(arr,unaff_R14,local_98);
        if (iVar14 < 1) {
          return;
        }
        sVar24 = stride;
        if (0x40 < stride) {
          lVar18 = (long)unaff_RBX * stride;
          lVar20 = (long)((long)psVar17->d + 1) * stride;
          lVar23 = 0;
          do {
            local_88 = *(uchar **)(local_90 + lVar23 + lVar20);
            uStack_80 = *(undefined8 *)(local_90 + lVar23 + lVar20 + 8);
            local_78 = *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x10);
            uStack_70 = *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x10 + 8);
            local_68 = *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x20);
            uStack_60 = *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x20 + 8);
            local_58 = *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x30);
            uStack_50 = *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x30 + 8);
            uVar7 = *(undefined8 *)(local_90 + lVar23 + lVar18 + 8);
            uVar8 = *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x10);
            uVar9 = *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x10 + 8);
            uVar10 = *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x20);
            uVar11 = *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x20 + 8);
            uVar12 = *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x30);
            uVar13 = *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x30 + 8);
            *(undefined8 *)(local_90 + lVar23 + lVar20) =
                 *(undefined8 *)(local_90 + lVar23 + lVar18);
            *(undefined8 *)(local_90 + lVar23 + lVar20 + 8) = uVar7;
            *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x30) = uVar12;
            *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x30 + 8) = uVar13;
            *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x20) = uVar10;
            *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x20 + 8) = uVar11;
            *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x10) = uVar8;
            *(undefined8 *)(local_90 + lVar23 + lVar20 + 0x10 + 8) = uVar9;
            *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x30) = local_58;
            *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x30 + 8) = uStack_50;
            *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x20) = local_68;
            *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x20 + 8) = uStack_60;
            *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x10) = local_78;
            *(undefined8 *)(local_90 + lVar23 + lVar18 + 0x10 + 8) = uStack_70;
            *(uchar **)(local_90 + lVar23 + lVar18) = local_88;
            *(undefined8 *)(local_90 + lVar23 + lVar18 + 8) = uStack_80;
            lVar2 = stride + lVar23;
            lVar23 = lVar23 + -0x40;
          } while (0x40 < lVar2 - 0x40U);
          sVar24 = lVar23 + stride;
        }
        i = (size_t)&local_88;
        pcStack_c0 = (code *)0x14a67c;
        local_a8 = psVar3;
        memcpy((void *)i,unaff_R14,sVar24);
        pcStack_c0 = (code *)0x14a68a;
        memmove(unaff_R14,arr,sVar24);
        pcStack_c0 = (code *)0x14a698;
        memcpy(arr,(void *)i,sVar24);
        unaff_RBX = local_a8;
      }
      psVar17 = unaff_RBX;
    } while (unaff_RBX < local_38);
  }
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_heap_down(unsigned char *arr, size_t i, size_t heap_size, size_t stride,
                            int (*cmp)(const void *, const void *, void *), void *cmp_data) {
    while (i < heap_size/2) {
        VERIFY_CHECK(i <= SIZE_MAX/2 - 1);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size <= SIZE_MAX
         * 2*i <= SIZE_MAX - 2
         */

        VERIFY_CHECK(secp256k1_heap_child1(i) < heap_size);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size
         * 2*i + 1 < heap_size
         * child1(i) < heap_size
         */

        /* Let [x] be notation for the contents at arr[x*stride].
         *
         * If [child1(i)] > [i] and [child2(i)] > [i],
         *   swap [i] with the larger child to ensure the new parent is larger
         *   than both children. When [child1(i)] == [child2(i)], swap [i] with
         *   [child2(i)].
         * Else if [child1(i)] > [i], swap [i] with [child1(i)].
         * Else if [child2(i)] > [i], swap [i] with [child2(i)].
         */
        if (secp256k1_heap_child2(i) < heap_size
                && 0 <= cmp(arr + secp256k1_heap_child2(i)*stride, arr + secp256k1_heap_child1(i)*stride, cmp_data)) {
            if (0 < cmp(arr + secp256k1_heap_child2(i)*stride, arr + i*stride, cmp_data)) {
                secp256k1_heap_swap(arr, i, secp256k1_heap_child2(i), stride);
                i = secp256k1_heap_child2(i);
            } else {
                /* At this point we have [child2(i)] >= [child1(i)] and we have
                 * [child2(i)] <= [i], and thus [child1(i)] <= [i] which means
                 * that the next comparison can be skipped. */
                return;
            }
        } else if (0 < cmp(arr + secp256k1_heap_child1(i)*stride, arr +         i*stride, cmp_data)) {
            secp256k1_heap_swap(arr, i, secp256k1_heap_child1(i), stride);
            i = secp256k1_heap_child1(i);
        } else {
            return;
        }
    }
    /* heap_size/2 <= i
     * heap_size/2 < i + 1
     * heap_size < 2*i + 2
     * heap_size <= 2*i + 1
     * heap_size <= child1(i)
     * Thus child1(i) and child2(i) are now out of bounds and we are at a leaf.
     */
}